

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lang_model.cpp
# Opt level: O2

string * __thiscall
NJamSpell::DumpKey<std::pair<unsigned_int,unsigned_int>>
          (string *__return_storage_ptr__,NJamSpell *this,pair<unsigned_int,_unsigned_int> *key)

{
  ostream local_198 [8];
  ostream out;
  stringbuf local_88 [8];
  stringbuf buf;
  
  std::__cxx11::stringbuf::stringbuf(local_88);
  std::ostream::ostream(local_198,(streambuf *)local_88);
  NHandyPack::TSerializer<std::pair<unsigned_int,_unsigned_int>,_void>::Dump
            (local_198,(pair<unsigned_int,_unsigned_int> *)this);
  std::__cxx11::stringbuf::str();
  std::ios_base::~ios_base((ios_base *)&out);
  std::__cxx11::stringbuf::~stringbuf(local_88);
  return __return_storage_ptr__;
}

Assistant:

std::string DumpKey(const T& key) {
    std::stringbuf buf;
    std::ostream out(&buf);
    NHandyPack::Dump(out, key);
    return buf.str();
}